

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O2

float __thiscall CNscPStackEntry::GetFloat(CNscPStackEntry *this)

{
  uchar *puVar1;
  
  if (this->m_nType != NscType_Float) {
    __assert_fail("m_nType == NscType_Float",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x14d,"float CNscPStackEntry::GetFloat() const");
  }
  if (this->m_nDataSize != 0x18) {
    __assert_fail("m_nDataSize == sizeof (NscPCodeConstantFloat)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x14e,"float CNscPStackEntry::GetFloat() const");
  }
  puVar1 = this->m_pauchData;
  if (*(int *)(puVar1 + 8) != 0x34) {
    __assert_fail("p ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x150,"float CNscPStackEntry::GetFloat() const");
  }
  if (*(int *)(puVar1 + 0xc) == 7) {
    return *(float *)(puVar1 + 0x10);
  }
  __assert_fail("p ->nType == NscType_Float",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0x151,"float CNscPStackEntry::GetFloat() const");
}

Assistant:

float GetFloat () const
	{
		assert (m_nType == NscType_Float);
		assert (m_nDataSize == sizeof (NscPCodeConstantFloat));
		NscPCodeConstantFloat *p = (NscPCodeConstantFloat *) m_pauchData;
		assert (p ->nOpCode == NscPCode_Constant);
		assert (p ->nType == NscType_Float);
		return p ->fValue;
	}